

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetCurrentMassMatrix(void *arkode_mem,SUNMatrix *M)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetCurrentMassMatrix",&local_10,&local_18);
  if (iVar1 == 0) {
    *M = local_18->M;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetCurrentMassMatrix(void *arkode_mem, SUNMatrix *M)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetCurrentMassMatrix",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);
  *M = arkls_mem->M;
  return(ARKLS_SUCCESS);
}